

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  undefined1 auVar7 [16];
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  Geometry *pGVar13;
  RTCIntersectArguments *pRVar14;
  undefined1 auVar15 [16];
  undefined1 (*pauVar16) [16];
  int iVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  ulong uVar20;
  RayQueryContext *pRVar21;
  ulong uVar22;
  RTCRayQueryContext *pRVar23;
  byte bVar24;
  RayQueryContext *extraout_RDX;
  RayQueryContext *extraout_RDX_00;
  ulong uVar25;
  undefined8 uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  uint uVar32;
  float fVar42;
  float fVar45;
  vint4 bi;
  undefined1 auVar33 [16];
  uint uVar43;
  uint uVar46;
  float fVar47;
  uint uVar48;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  undefined1 auVar41 [16];
  float fVar49;
  float fVar52;
  float fVar53;
  vint4 bi_1;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar58;
  float fVar60;
  vint4 ai;
  uint uVar56;
  uint uVar59;
  uint uVar61;
  float fVar62;
  uint uVar63;
  undefined1 auVar57 [16];
  vint4 ai_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar69;
  float fVar70;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar79;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar80;
  undefined1 auVar78 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_11bc [4];
  undefined1 local_11b8 [8];
  float fStack_11b0;
  float fStack_11ac;
  undefined8 local_11a8;
  float fStack_11a0;
  float fStack_119c;
  undefined1 local_1198 [16];
  RayQueryContext *local_1188;
  Scene *local_1180;
  float local_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  RTCFilterFunctionNArguments local_1168;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  Geometry *local_1120;
  RayQueryContext *local_1118;
  long local_1110;
  float local_1108;
  float local_1104;
  float local_1100;
  float local_10fc;
  float local_10f8;
  undefined4 local_10f4;
  uint local_10f0;
  uint local_10ec;
  uint local_10e8;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  float local_10c8 [4];
  float local_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8;
  float fStack_10a4;
  float fStack_10a0;
  float fStack_109c;
  undefined1 local_1098 [16];
  undefined1 local_1078 [16];
  float local_1068 [4];
  float local_1058 [4];
  float local_1048 [4];
  undefined1 local_1038 [16];
  float local_1028 [4];
  float local_1018 [4];
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  uint local_f98;
  uint uStack_f94;
  uint uStack_f90;
  uint uStack_f8c;
  undefined8 local_f88;
  undefined8 uStack_f80;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_1188 = context;
    pauVar18 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    fVar81 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar44 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar93 = (ray->super_RayK<1>).org.field_0.m128[2];
    fVar82 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar6 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar57._0_4_ = (ray->super_RayK<1>).tfar;
    fVar91 = 0.0;
    if (0.0 <= auVar57._0_4_) {
      fVar91 = auVar57._0_4_;
    }
    auVar33._4_4_ = -(uint)(ABS(aVar6.y) < DAT_01f80d30._4_4_);
    auVar33._0_4_ = -(uint)(ABS(aVar6.x) < (float)DAT_01f80d30);
    auVar33._8_4_ = -(uint)(ABS(aVar6.z) < DAT_01f80d30._8_4_);
    auVar33._12_4_ = -(uint)(ABS(aVar6.field_3.w) < DAT_01f80d30._12_4_);
    auVar64 = blendvps((undefined1  [16])aVar6,_DAT_01f80d30,auVar33);
    auVar57._0_4_ = 0.0;
    if (0.0 <= fVar82) {
      auVar57._0_4_ = fVar82;
    }
    auVar33 = rcpps(auVar33,auVar64);
    fVar89 = auVar33._0_4_;
    fVar92 = auVar33._4_4_;
    fVar95 = auVar33._8_4_;
    fVar89 = (1.0 - auVar64._0_4_ * fVar89) * fVar89 + fVar89;
    fVar92 = (1.0 - auVar64._4_4_ * fVar92) * fVar92 + fVar92;
    fVar95 = (1.0 - auVar64._8_4_ * fVar95) * fVar95 + fVar95;
    local_11a8 = (ulong)(fVar89 < 0.0) << 4;
    uVar27 = (ulong)(fVar92 < 0.0) << 4 | 0x20;
    uVar30 = (ulong)(fVar95 < 0.0) << 4 | 0x40;
    uVar29 = local_11a8 ^ 0x10;
    _local_f98 = mm_lookupmask_ps._240_8_;
    _uStack_f90 = mm_lookupmask_ps._248_8_;
    local_fa8 = fVar93;
    fStack_fa4 = fVar93;
    fStack_fa0 = fVar93;
    fStack_f9c = fVar93;
    local_fb8 = auVar57._0_4_;
    fStack_fb4 = auVar57._0_4_;
    fStack_fb0 = auVar57._0_4_;
    fStack_fac = auVar57._0_4_;
    local_fc8 = fVar95;
    fStack_fc4 = fVar95;
    fStack_fc0 = fVar95;
    fStack_fbc = fVar95;
    local_fd8 = fVar81;
    fStack_fd4 = fVar81;
    fStack_fd0 = fVar81;
    fStack_fcc = fVar81;
    local_fe8 = fVar44;
    fStack_fe4 = fVar44;
    fStack_fe0 = fVar44;
    fStack_fdc = fVar44;
    local_ff8 = fVar89;
    fStack_ff4 = fVar89;
    fStack_ff0 = fVar89;
    fStack_fec = fVar89;
    local_1008 = fVar92;
    fStack_1004 = fVar92;
    fStack_1000 = fVar92;
    fStack_ffc = fVar92;
    fVar99 = fVar91;
    fVar96 = fVar91;
    fVar82 = fVar91;
    fVar90 = fVar92;
    fVar80 = fVar92;
    fVar79 = fVar92;
    fVar75 = fVar89;
    fVar71 = fVar89;
    fVar70 = fVar89;
    fVar69 = fVar44;
    fVar66 = fVar44;
    fVar54 = fVar44;
    fVar53 = fVar81;
    fVar52 = fVar81;
    fVar49 = fVar81;
    fVar98 = fVar95;
    fVar94 = fVar95;
    fVar97 = fVar95;
    fVar88 = auVar57._0_4_;
    fVar87 = auVar57._0_4_;
    fVar84 = auVar57._0_4_;
    fVar86 = fVar93;
    fVar83 = fVar93;
    fVar85 = fVar93;
LAB_00d8df38:
    do {
      pauVar16 = pauVar18 + -1;
      pauVar18 = pauVar18 + -1;
      pfVar4 = &(ray->super_RayK<1>).tfar;
      if (*(float *)((long)*pauVar16 + 8) < *pfVar4 || *(float *)((long)*pauVar16 + 8) == *pfVar4) {
        uVar25 = *(ulong *)*pauVar18;
        while ((uVar25 & 8) == 0) {
          pfVar4 = (float *)(uVar25 + 0x20 + local_11a8);
          fVar31 = (*pfVar4 - fVar49) * fVar70;
          fVar42 = (pfVar4[1] - fVar52) * fVar71;
          fVar45 = (pfVar4[2] - fVar53) * fVar75;
          fVar47 = (pfVar4[3] - fVar81) * fVar89;
          pfVar4 = (float *)(uVar25 + 0x20 + uVar27);
          fVar55 = (*pfVar4 - fVar54) * fVar79;
          fVar58 = (pfVar4[1] - fVar66) * fVar80;
          fVar60 = (pfVar4[2] - fVar69) * fVar90;
          fVar62 = (pfVar4[3] - fVar44) * fVar92;
          uVar56 = (uint)((int)fVar55 < (int)fVar31) * (int)fVar31 |
                   (uint)((int)fVar55 >= (int)fVar31) * (int)fVar55;
          uVar59 = (uint)((int)fVar58 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar58 >= (int)fVar42) * (int)fVar58;
          uVar61 = (uint)((int)fVar60 < (int)fVar45) * (int)fVar45 |
                   (uint)((int)fVar60 >= (int)fVar45) * (int)fVar60;
          uVar63 = (uint)((int)fVar62 < (int)fVar47) * (int)fVar47 |
                   (uint)((int)fVar62 >= (int)fVar47) * (int)fVar62;
          pfVar4 = (float *)(uVar25 + 0x20 + uVar30);
          fVar31 = (*pfVar4 - fVar85) * fVar97;
          fVar42 = (pfVar4[1] - fVar83) * fVar94;
          fVar45 = (pfVar4[2] - fVar86) * fVar98;
          fVar47 = (pfVar4[3] - fVar93) * fVar95;
          uVar32 = (uint)((int)fVar31 < (int)fVar84) * (int)fVar84 |
                   (uint)((int)fVar31 >= (int)fVar84) * (int)fVar31;
          uVar43 = (uint)((int)fVar42 < (int)fVar87) * (int)fVar87 |
                   (uint)((int)fVar42 >= (int)fVar87) * (int)fVar42;
          uVar46 = (uint)((int)fVar45 < (int)fVar88) * (int)fVar88 |
                   (uint)((int)fVar45 >= (int)fVar88) * (int)fVar45;
          uVar48 = (uint)((int)fVar47 < (int)auVar57._0_4_) * (int)auVar57._0_4_ |
                   (uint)((int)fVar47 >= (int)auVar57._0_4_) * (int)fVar47;
          local_10c8[0] =
               (float)(((int)uVar32 < (int)uVar56) * uVar56 | ((int)uVar32 >= (int)uVar56) * uVar32)
          ;
          local_10c8[1] =
               (float)(((int)uVar43 < (int)uVar59) * uVar59 | ((int)uVar43 >= (int)uVar59) * uVar43)
          ;
          local_10c8[2] =
               (float)(((int)uVar46 < (int)uVar61) * uVar61 | ((int)uVar46 >= (int)uVar61) * uVar46)
          ;
          local_10c8[3] =
               (float)(((int)uVar48 < (int)uVar63) * uVar63 | ((int)uVar48 >= (int)uVar63) * uVar48)
          ;
          pfVar4 = (float *)(uVar25 + 0x20 + uVar29);
          fVar31 = (*pfVar4 - fVar49) * fVar70;
          fVar42 = (pfVar4[1] - fVar52) * fVar71;
          fVar45 = (pfVar4[2] - fVar53) * fVar75;
          fVar47 = (pfVar4[3] - fVar81) * fVar89;
          pfVar4 = (float *)(uVar25 + 0x20 + (uVar27 ^ 0x10));
          fVar55 = (*pfVar4 - fVar54) * fVar79;
          fVar58 = (pfVar4[1] - fVar66) * fVar80;
          fVar60 = (pfVar4[2] - fVar69) * fVar90;
          fVar62 = (pfVar4[3] - fVar44) * fVar92;
          uVar56 = (uint)((int)fVar31 < (int)fVar55) * (int)fVar31 |
                   (uint)((int)fVar31 >= (int)fVar55) * (int)fVar55;
          uVar59 = (uint)((int)fVar42 < (int)fVar58) * (int)fVar42 |
                   (uint)((int)fVar42 >= (int)fVar58) * (int)fVar58;
          uVar61 = (uint)((int)fVar45 < (int)fVar60) * (int)fVar45 |
                   (uint)((int)fVar45 >= (int)fVar60) * (int)fVar60;
          uVar63 = (uint)((int)fVar47 < (int)fVar62) * (int)fVar47 |
                   (uint)((int)fVar47 >= (int)fVar62) * (int)fVar62;
          pfVar4 = (float *)(uVar25 + 0x20 + (uVar30 ^ 0x10));
          fVar31 = (*pfVar4 - fVar85) * fVar97;
          fVar42 = (pfVar4[1] - fVar83) * fVar94;
          fVar45 = (pfVar4[2] - fVar86) * fVar98;
          fVar47 = (pfVar4[3] - fVar93) * fVar95;
          uVar32 = (uint)((int)fVar82 < (int)fVar31) * (int)fVar82 |
                   (uint)((int)fVar82 >= (int)fVar31) * (int)fVar31;
          uVar43 = (uint)((int)fVar96 < (int)fVar42) * (int)fVar96 |
                   (uint)((int)fVar96 >= (int)fVar42) * (int)fVar42;
          uVar46 = (uint)((int)fVar99 < (int)fVar45) * (int)fVar99 |
                   (uint)((int)fVar99 >= (int)fVar45) * (int)fVar45;
          uVar48 = (uint)((int)fVar91 < (int)fVar47) * (int)fVar91 |
                   (uint)((int)fVar91 >= (int)fVar47) * (int)fVar47;
          auVar64._0_4_ =
               -(uint)((int)(((int)uVar56 < (int)uVar32) * uVar56 |
                            ((int)uVar56 >= (int)uVar32) * uVar32) < (int)local_10c8[0]);
          auVar64._4_4_ =
               -(uint)((int)(((int)uVar59 < (int)uVar43) * uVar59 |
                            ((int)uVar59 >= (int)uVar43) * uVar43) < (int)local_10c8[1]);
          auVar64._8_4_ =
               -(uint)((int)(((int)uVar61 < (int)uVar46) * uVar61 |
                            ((int)uVar61 >= (int)uVar46) * uVar46) < (int)local_10c8[2]);
          auVar64._12_4_ =
               -(uint)((int)(((int)uVar63 < (int)uVar48) * uVar63 |
                            ((int)uVar63 >= (int)uVar48) * uVar48) < (int)local_10c8[3]);
          uVar32 = movmskps((int)context,auVar64);
          context = (RayQueryContext *)(ulong)uVar32;
          if (uVar32 == 0xf) {
            if (pauVar18 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d8df38;
          }
          bVar24 = (byte)uVar32 ^ 0xf;
          uVar22 = uVar25 & 0xfffffffffffffff0;
          context = (RayQueryContext *)0x0;
          if (bVar24 != 0) {
            for (; (bVar24 >> (long)context & 1) == 0;
                context = (RayQueryContext *)((long)&context->scene + 1)) {
            }
          }
          uVar25 = *(ulong *)(uVar22 + (long)context * 8);
          uVar32 = bVar24 - 1 & (uint)bVar24;
          if (uVar32 != 0) {
            fVar31 = local_10c8[(long)context];
            lVar28 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
              }
            }
            uVar20 = *(ulong *)(uVar22 + lVar28 * 8);
            fVar42 = local_10c8[lVar28];
            uVar32 = uVar32 - 1 & uVar32;
            context = (RayQueryContext *)(ulong)uVar32;
            if (uVar32 == 0) {
              if ((uint)fVar31 < (uint)fVar42) {
                *(ulong *)*pauVar18 = uVar20;
                *(float *)((long)*pauVar18 + 8) = fVar42;
                pauVar18 = pauVar18 + 1;
              }
              else {
                *(ulong *)*pauVar18 = uVar25;
                *(float *)((long)*pauVar18 + 8) = fVar31;
                pauVar18 = pauVar18 + 1;
                uVar25 = uVar20;
              }
            }
            else {
              auVar68._8_4_ = fVar31;
              auVar68._0_8_ = uVar25;
              auVar68._12_4_ = 0;
              auVar73._8_4_ = fVar42;
              auVar73._0_8_ = uVar20;
              auVar73._12_4_ = 0;
              lVar28 = 0;
              if (context != (RayQueryContext *)0x0) {
                for (; (uVar32 >> lVar28 & 1) == 0; lVar28 = lVar28 + 1) {
                }
              }
              uVar26 = *(undefined8 *)(uVar22 + lVar28 * 8);
              fVar45 = local_10c8[lVar28];
              auVar77._8_4_ = fVar45;
              auVar77._0_8_ = uVar26;
              auVar77._12_4_ = 0;
              auVar74._8_4_ = -(uint)((int)fVar31 < (int)fVar42);
              uVar32 = uVar32 - 1 & uVar32;
              if (uVar32 == 0) {
                auVar74._4_4_ = auVar74._8_4_;
                auVar74._0_4_ = auVar74._8_4_;
                auVar74._12_4_ = auVar74._8_4_;
                auVar72._8_4_ = fVar42;
                auVar72._0_8_ = uVar20;
                auVar72._12_4_ = 0;
                auVar64 = blendvps(auVar72,auVar68,auVar74);
                auVar33 = blendvps(auVar68,auVar73,auVar74);
                auVar34._8_4_ = -(uint)(auVar64._8_4_ < (int)fVar45);
                auVar34._4_4_ = auVar34._8_4_;
                auVar34._0_4_ = auVar34._8_4_;
                auVar34._12_4_ = auVar34._8_4_;
                auVar67._8_4_ = fVar45;
                auVar67._0_8_ = uVar26;
                auVar67._12_4_ = 0;
                auVar68 = blendvps(auVar67,auVar64,auVar34);
                auVar73 = blendvps(auVar64,auVar77,auVar34);
                auVar35._8_4_ = -(uint)(auVar33._8_4_ < auVar73._8_4_);
                auVar35._4_4_ = auVar35._8_4_;
                auVar35._0_4_ = auVar35._8_4_;
                auVar35._12_4_ = auVar35._8_4_;
                auVar64 = blendvps(auVar73,auVar33,auVar35);
                auVar33 = blendvps(auVar33,auVar73,auVar35);
                *pauVar18 = auVar33;
                pauVar18[1] = auVar64;
                uVar25 = auVar68._0_8_;
                pauVar18 = pauVar18 + 2;
              }
              else {
                context = (RayQueryContext *)0x0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
                auVar36._4_4_ = auVar74._8_4_;
                auVar36._0_4_ = auVar74._8_4_;
                auVar36._8_4_ = auVar74._8_4_;
                auVar36._12_4_ = auVar74._8_4_;
                auVar74 = blendvps(auVar73,auVar68,auVar36);
                auVar33 = blendvps(auVar68,auVar73,auVar36);
                auVar76._8_4_ = local_10c8[(long)context];
                auVar76._0_8_ = *(undefined8 *)(uVar22 + (long)context * 8);
                auVar76._12_4_ = 0;
                auVar37._8_4_ = -(uint)((int)fVar45 < (int)local_10c8[(long)context]);
                auVar37._4_4_ = auVar37._8_4_;
                auVar37._0_4_ = auVar37._8_4_;
                auVar37._12_4_ = auVar37._8_4_;
                auVar68 = blendvps(auVar76,auVar77,auVar37);
                auVar64 = blendvps(auVar77,auVar76,auVar37);
                auVar38._8_4_ = -(uint)(auVar33._8_4_ < auVar64._8_4_);
                auVar38._4_4_ = auVar38._8_4_;
                auVar38._0_4_ = auVar38._8_4_;
                auVar38._12_4_ = auVar38._8_4_;
                auVar77 = blendvps(auVar64,auVar33,auVar38);
                auVar33 = blendvps(auVar33,auVar64,auVar38);
                auVar39._8_4_ = -(uint)(auVar74._8_4_ < auVar68._8_4_);
                auVar39._4_4_ = auVar39._8_4_;
                auVar39._0_4_ = auVar39._8_4_;
                auVar39._12_4_ = auVar39._8_4_;
                auVar64 = blendvps(auVar68,auVar74,auVar39);
                auVar73 = blendvps(auVar74,auVar68,auVar39);
                auVar40._8_4_ = -(uint)(auVar73._8_4_ < auVar77._8_4_);
                auVar40._4_4_ = auVar40._8_4_;
                auVar40._0_4_ = auVar40._8_4_;
                auVar40._12_4_ = auVar40._8_4_;
                auVar68 = blendvps(auVar77,auVar73,auVar40);
                auVar73 = blendvps(auVar73,auVar77,auVar40);
                *pauVar18 = auVar33;
                pauVar18[1] = auVar73;
                pauVar18[2] = auVar68;
                uVar25 = auVar64._0_8_;
                pauVar18 = pauVar18 + 3;
              }
            }
          }
        }
        local_1110 = (ulong)((uint)uVar25 & 0xf) - 8;
        if (local_1110 != 0) {
          uVar25 = uVar25 & 0xfffffffffffffff0;
          local_1180 = local_1188->scene;
          lVar28 = 0;
          uVar22 = local_11a8;
          do {
            lVar19 = lVar28 * 0x50;
            ppfVar8 = (local_1180->vertices).items;
            pfVar9 = ppfVar8[*(uint *)(uVar25 + 0x30 + lVar19)];
            pfVar4 = pfVar9 + *(uint *)(uVar25 + lVar19);
            auVar57._0_4_ = *pfVar4;
            fVar91 = pfVar4[1];
            fVar81 = pfVar4[2];
            pfVar4 = pfVar9 + *(uint *)(uVar25 + 0x10 + lVar19);
            pfVar9 = pfVar9 + *(uint *)(uVar25 + 0x20 + lVar19);
            pfVar10 = ppfVar8[*(uint *)(uVar25 + 0x34 + lVar19)];
            pfVar1 = pfVar10 + *(uint *)(uVar25 + 4 + lVar19);
            fVar44 = *pfVar1;
            fVar93 = pfVar1[1];
            fVar82 = pfVar1[2];
            pfVar1 = pfVar10 + *(uint *)(uVar25 + 0x14 + lVar19);
            pfVar10 = pfVar10 + *(uint *)(uVar25 + 0x24 + lVar19);
            pfVar11 = ppfVar8[*(uint *)(uVar25 + 0x38 + lVar19)];
            pfVar2 = pfVar11 + *(uint *)(uVar25 + 8 + lVar19);
            fStack_11a0 = *pfVar2;
            fVar85 = pfVar2[1];
            fVar83 = pfVar2[2];
            pfVar2 = pfVar11 + *(uint *)(uVar25 + 0x18 + lVar19);
            pfVar11 = pfVar11 + *(uint *)(uVar25 + 0x28 + lVar19);
            pfVar12 = ppfVar8[*(uint *)(uVar25 + 0x3c + lVar19)];
            pfVar3 = pfVar12 + *(uint *)(uVar25 + 0xc + lVar19);
            fStack_119c = *pfVar3;
            fVar86 = pfVar3[1];
            fVar84 = pfVar3[2];
            pfVar3 = pfVar12 + *(uint *)(uVar25 + 0x1c + lVar19);
            context = (RayQueryContext *)(ulong)*(uint *)(uVar25 + 0x2c + lVar19);
            pfVar12 = pfVar12 + (long)context;
            puVar5 = (undefined8 *)(uVar25 + 0x30 + lVar19);
            local_f88 = *puVar5;
            uStack_f80 = puVar5[1];
            puVar5 = (undefined8 *)(uVar25 + 0x40 + lVar19);
            local_10d8 = *puVar5;
            uStack_10d0 = puVar5[1];
            local_1138 = auVar57._0_4_ - *pfVar4;
            fStack_1134 = fVar44 - *pfVar1;
            fStack_1130 = fStack_11a0 - *pfVar2;
            fStack_112c = fStack_119c - *pfVar3;
            fVar90 = fVar91 - pfVar4[1];
            fVar92 = fVar93 - pfVar1[1];
            fVar96 = fVar85 - pfVar2[1];
            fVar99 = fVar86 - pfVar3[1];
            fVar42 = fVar81 - pfVar4[2];
            fVar45 = fVar82 - pfVar1[2];
            fVar47 = fVar83 - pfVar2[2];
            fVar55 = fVar84 - pfVar3[2];
            fVar49 = *pfVar9 - auVar57._0_4_;
            fVar52 = *pfVar10 - fVar44;
            fVar53 = *pfVar11 - fStack_11a0;
            fVar54 = *pfVar12 - fStack_119c;
            fVar75 = pfVar9[1] - fVar91;
            fVar89 = pfVar10[1] - fVar93;
            fVar79 = pfVar11[1] - fVar85;
            fVar80 = pfVar12[1] - fVar86;
            fVar66 = pfVar9[2] - fVar81;
            fVar69 = pfVar10[2] - fVar82;
            fVar70 = pfVar11[2] - fVar83;
            fVar71 = pfVar12[2] - fVar84;
            local_1038._0_4_ = fVar42 * fVar75 - fVar90 * fVar66;
            local_1038._4_4_ = fVar45 * fVar89 - fVar92 * fVar69;
            local_1038._8_4_ = fVar47 * fVar79 - fVar96 * fVar70;
            local_1038._12_4_ = fVar55 * fVar80 - fVar99 * fVar71;
            fVar87 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar88 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar97 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar94 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar98 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar95 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar57._0_4_ = auVar57._0_4_ - fVar87;
            fVar44 = fVar44 - fVar87;
            fStack_11a0 = fStack_11a0 - fVar87;
            fStack_119c = fStack_119c - fVar87;
            local_11b8._0_4_ = fVar91 - fVar88;
            local_11b8._4_4_ = fVar93 - fVar88;
            fStack_11b0 = fVar85 - fVar88;
            fStack_11ac = fVar86 - fVar88;
            fVar101 = auVar57._0_4_ * fVar98 - (float)local_11b8._0_4_ * fVar94;
            fVar102 = fVar44 * fVar98 - (float)local_11b8._4_4_ * fVar94;
            fVar103 = fStack_11a0 * fVar98 - fStack_11b0 * fVar94;
            fVar104 = fStack_119c * fVar98 - fStack_11ac * fVar94;
            local_1028[0] = local_1138 * fVar66 - fVar42 * fVar49;
            local_1028[1] = fStack_1134 * fVar69 - fVar45 * fVar52;
            local_1028[2] = fStack_1130 * fVar70 - fVar47 * fVar53;
            local_1028[3] = fStack_112c * fVar71 - fVar55 * fVar54;
            fVar81 = fVar81 - fVar97;
            fVar82 = fVar82 - fVar97;
            fVar83 = fVar83 - fVar97;
            fVar84 = fVar84 - fVar97;
            local_11a8 = CONCAT44(fVar44,auVar57._0_4_);
            fVar58 = fVar81 * fVar94 - auVar57._0_4_ * fVar95;
            fVar60 = fVar82 * fVar94 - fVar44 * fVar95;
            fVar62 = fVar83 * fVar94 - fStack_11a0 * fVar95;
            fVar100 = fVar84 * fVar94 - fStack_119c * fVar95;
            local_1018[0] = fVar90 * fVar49 - local_1138 * fVar75;
            local_1018[1] = fVar92 * fVar52 - fStack_1134 * fVar89;
            local_1018[2] = fVar96 * fVar53 - fStack_1130 * fVar79;
            local_1018[3] = fVar99 * fVar54 - fStack_112c * fVar80;
            fVar91 = (float)local_11b8._0_4_ * fVar95 - fVar81 * fVar98;
            fVar93 = (float)local_11b8._4_4_ * fVar95 - fVar82 * fVar98;
            fVar97 = fStack_11b0 * fVar95 - fVar83 * fVar98;
            fVar31 = fStack_11ac * fVar95 - fVar84 * fVar98;
            fVar85 = fVar94 * local_1038._0_4_ + fVar98 * local_1028[0] + fVar95 * local_1018[0];
            fVar86 = fVar94 * local_1038._4_4_ + fVar98 * local_1028[1] + fVar95 * local_1018[1];
            fVar87 = fVar94 * local_1038._8_4_ + fVar98 * local_1028[2] + fVar95 * local_1018[2];
            fVar88 = fVar94 * local_1038._12_4_ + fVar98 * local_1028[3] + fVar95 * local_1018[3];
            uVar32 = (uint)fVar85 & 0x80000000;
            uVar43 = (uint)fVar86 & 0x80000000;
            uVar46 = (uint)fVar87 & 0x80000000;
            uVar48 = (uint)fVar88 & 0x80000000;
            local_10c8[0] =
                 (float)((uint)(fVar49 * fVar91 + fVar75 * fVar58 + fVar66 * fVar101) ^ uVar32);
            local_10c8[1] =
                 (float)((uint)(fVar52 * fVar93 + fVar89 * fVar60 + fVar69 * fVar102) ^ uVar43);
            local_10c8[2] =
                 (float)((uint)(fVar53 * fVar97 + fVar79 * fVar62 + fVar70 * fVar103) ^ uVar46);
            local_10c8[3] =
                 (float)((uint)(fVar54 * fVar31 + fVar80 * fVar100 + fVar71 * fVar104) ^ uVar48);
            local_10b8 = (float)((uint)(fVar91 * local_1138 + fVar58 * fVar90 + fVar101 * fVar42) ^
                                uVar32);
            fStack_10b4 = (float)((uint)(fVar93 * fStack_1134 + fVar60 * fVar92 + fVar102 * fVar45)
                                 ^ uVar43);
            fStack_10b0 = (float)((uint)(fVar97 * fStack_1130 + fVar62 * fVar96 + fVar103 * fVar47)
                                 ^ uVar46);
            fStack_10ac = (float)((uint)(fVar31 * fStack_112c + fVar100 * fVar99 + fVar104 * fVar55)
                                 ^ uVar48);
            fVar91 = ABS(fVar85);
            fVar93 = ABS(fVar86);
            local_1098._0_8_ = CONCAT44(fVar86,fVar85) & 0x7fffffff7fffffff;
            local_1098._8_4_ = ABS(fVar87);
            local_1098._12_4_ = ABS(fVar88);
            auVar78._0_4_ =
                 -(uint)(local_10c8[0] + local_10b8 <= fVar91) &
                 -(uint)((0.0 <= local_10b8 && 0.0 <= local_10c8[0]) && fVar85 != 0.0) & local_f98;
            auVar78._4_4_ =
                 -(uint)(local_10c8[1] + fStack_10b4 <= fVar93) &
                 -(uint)((0.0 <= fStack_10b4 && 0.0 <= local_10c8[1]) && fVar86 != 0.0) & uStack_f94
            ;
            auVar78._8_4_ =
                 -(uint)(local_10c8[2] + fStack_10b0 <= local_1098._8_4_) &
                 -(uint)((0.0 <= fStack_10b0 && 0.0 <= local_10c8[2]) && fVar87 != 0.0) & uStack_f90
            ;
            auVar78._12_4_ =
                 -(uint)(local_10c8[3] + fStack_10ac <= local_1098._12_4_) &
                 -(uint)((0.0 <= fStack_10ac && 0.0 <= local_10c8[3]) && fVar88 != 0.0) & uStack_f8c
            ;
            iVar17 = movmskps((int)lVar19,auVar78);
            local_11a8 = uVar22;
            if (iVar17 != 0) {
              local_10a8 = (float)(uVar32 ^ (uint)(auVar57._0_4_ * local_1038._0_4_ +
                                                  (float)local_11b8._0_4_ * local_1028[0] +
                                                  fVar81 * local_1018[0]));
              fStack_10a4 = (float)(uVar43 ^ (uint)(fVar44 * local_1038._4_4_ +
                                                   (float)local_11b8._4_4_ * local_1028[1] +
                                                   fVar82 * local_1018[1]));
              fStack_10a0 = (float)(uVar46 ^ (uint)(fStack_11a0 * local_1038._8_4_ +
                                                   fStack_11b0 * local_1028[2] +
                                                   fVar83 * local_1018[2]));
              fStack_109c = (float)(uVar48 ^ (uint)(fStack_119c * local_1038._12_4_ +
                                                   fStack_11ac * local_1028[3] +
                                                   fVar84 * local_1018[3]));
              auVar57._0_4_ = (ray->super_RayK<1>).org.field_0.m128[3];
              auVar7._0_4_ = (ray->super_RayK<1>).tfar;
              auVar7._4_4_ = (ray->super_RayK<1>).mask;
              auVar7._8_4_ = (ray->super_RayK<1>).id;
              auVar7._12_4_ = (ray->super_RayK<1>).flags;
              auVar41._0_4_ =
                   -(uint)(local_10a8 <= (float)auVar7._0_4_ * fVar91 &&
                          auVar57._0_4_ * fVar91 < local_10a8) & auVar78._0_4_;
              auVar41._4_4_ =
                   -(uint)(fStack_10a4 <= (float)auVar7._0_4_ * fVar93 &&
                          auVar57._0_4_ * fVar93 < fStack_10a4) & auVar78._4_4_;
              auVar41._8_4_ =
                   -(uint)(fStack_10a0 <= (float)auVar7._0_4_ * local_1098._8_4_ &&
                          auVar57._0_4_ * local_1098._8_4_ < fStack_10a0) & auVar78._8_4_;
              auVar41._12_4_ =
                   -(uint)(fStack_109c <= (float)auVar7._0_4_ * local_1098._12_4_ &&
                          auVar57._0_4_ * local_1098._12_4_ < fStack_109c) & auVar78._12_4_;
              iVar17 = movmskps(iVar17,auVar41);
              if (iVar17 != 0) {
                local_1138 = (float)lVar28;
                fStack_1134 = (float)((ulong)lVar28 >> 0x20);
                local_1078 = auVar41;
                local_1198 = auVar41;
                auVar57 = rcpps(local_1038,local_1098);
                fVar81 = auVar57._4_4_;
                fVar44 = auVar57._8_4_;
                fVar82 = auVar57._12_4_;
                auVar57._0_4_ = (1.0 - fVar91 * auVar57._0_4_) * auVar57._0_4_ + auVar57._0_4_;
                fVar81 = (1.0 - fVar93 * fVar81) * fVar81 + fVar81;
                fVar44 = (1.0 - local_1098._8_4_ * fVar44) * fVar44 + fVar44;
                fVar82 = (1.0 - local_1098._12_4_ * fVar82) * fVar82 + fVar82;
                local_11b8._0_4_ = local_10a8 * auVar57._0_4_;
                local_11b8._4_4_ = fStack_10a4 * fVar81;
                fStack_11b0 = fStack_10a0 * fVar44;
                fStack_11ac = fStack_109c * fVar82;
                local_1048[0] = (float)local_11b8._0_4_;
                local_1048[1] = (float)local_11b8._4_4_;
                local_1048[2] = fStack_11b0;
                local_1048[3] = fStack_11ac;
                local_1068[0] = local_10c8[0] * auVar57._0_4_;
                local_1068[1] = local_10c8[1] * fVar81;
                local_1068[2] = local_10c8[2] * fVar44;
                local_1068[3] = local_10c8[3] * fVar82;
                local_1058[0] = auVar57._0_4_ * local_10b8;
                local_1058[1] = fVar81 * fStack_10b4;
                local_1058[2] = fVar44 * fStack_10b0;
                local_1058[3] = fVar82 * fStack_10ac;
                auVar15._4_4_ = local_11b8._4_4_;
                auVar15._0_4_ = local_11b8._0_4_;
                auVar15._8_4_ = fStack_11b0;
                auVar15._12_4_ = fStack_11ac;
                auVar33 = blendvps(_DAT_01f7a9f0,auVar15,auVar41);
                auVar65._4_4_ = auVar33._0_4_;
                auVar65._0_4_ = auVar33._4_4_;
                auVar65._8_4_ = auVar33._12_4_;
                auVar65._12_4_ = auVar33._8_4_;
                auVar57 = minps(auVar65,auVar33);
                auVar50._0_8_ = auVar57._8_8_;
                auVar50._8_4_ = auVar57._0_4_;
                auVar50._12_4_ = auVar57._4_4_;
                auVar57 = minps(auVar50,auVar57);
                auVar51._0_8_ =
                     CONCAT44(-(uint)(auVar57._4_4_ == auVar33._4_4_) & auVar41._4_4_,
                              -(uint)(auVar57._0_4_ == auVar33._0_4_) & auVar41._0_4_);
                auVar51._8_4_ = -(uint)(auVar57._8_4_ == auVar33._8_4_) & auVar41._8_4_;
                auVar51._12_4_ = -(uint)(auVar57._12_4_ == auVar33._12_4_) & auVar41._12_4_;
                iVar17 = movmskps(iVar17,auVar51);
                if (iVar17 != 0) {
                  auVar41._8_4_ = auVar51._8_4_;
                  auVar41._0_8_ = auVar51._0_8_;
                  auVar41._12_4_ = auVar51._12_4_;
                }
                uVar22 = extractps(auVar7,1);
                auVar57._4_4_ = movmskps(iVar17,auVar41);
                uVar20 = CONCAT44((int)((ulong)lVar19 >> 0x20),auVar57._4_4_);
                context = (RayQueryContext *)0x0;
                auVar57._0_4_ = (float)auVar7._0_4_;
                auVar57._4_4_ = auVar7._4_4_;
                auVar57._8_4_ = auVar7._8_4_;
                auVar57._12_4_ = auVar7._12_4_;
                if (uVar20 != 0) {
                  for (; (uVar20 >> (long)context & 1) == 0;
                      context = (RayQueryContext *)((long)&context->scene + 1)) {
                  }
                }
LAB_00d8e601:
                uVar32 = *(uint *)((long)&local_f88 + (long)context * 4);
                pRVar21 = (RayQueryContext *)(ulong)uVar32;
                pGVar13 = (local_1180->geometries).items[(long)pRVar21].ptr;
                uVar43 = (uint)uVar22;
                if ((pGVar13->mask & uVar43) == 0) {
                  *(undefined4 *)(local_1198 + (long)context * 4) = 0;
                  goto LAB_00d8e66c;
                }
                pRVar14 = local_1188->args;
                if (pRVar14->filter == (RTCFilterFunctionN)0x0) {
                  pRVar23 = local_1188->user;
                  if (pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    auVar57._0_4_ = local_1068[(long)context];
                    fVar91 = local_1058[(long)context];
                    (ray->super_RayK<1>).tfar = local_1048[(long)context];
                    (ray->Ng).field_0.field_0.x = *(float *)(local_1038 + (long)context * 4);
                    (ray->Ng).field_0.field_0.y = local_1028[(long)context];
                    (ray->Ng).field_0.field_0.z = local_1018[(long)context];
                    ray->u = auVar57._0_4_;
                    ray->v = fVar91;
                    uVar43 = *(uint *)((long)&local_10d8 + (long)context * 4);
                    context = (RayQueryContext *)(ulong)uVar43;
                    ray->primID = uVar43;
                    ray->geomID = uVar32;
                    ray->instID[0] = pRVar23->instID[0];
                    ray->instPrimID[0] = pRVar23->instPrimID[0];
LAB_00d8e96c:
                    lVar28 = CONCAT44(fStack_1134,local_1138);
                    goto LAB_00d8e4c6;
                  }
                  local_1178 = auVar57._0_4_;
                  uStack_1174 = auVar57._4_4_;
                  uStack_1170 = auVar57._8_4_;
                  uStack_116c = auVar57._12_4_;
                }
                else {
                  local_1178 = auVar57._0_4_;
                  uStack_1174 = auVar57._4_4_;
                  uStack_1170 = auVar57._8_4_;
                  uStack_116c = auVar57._12_4_;
                  pRVar23 = local_1188->user;
                }
                local_1108 = *(float *)(local_1038 + (long)context * 4);
                local_1104 = local_1028[(long)context];
                local_1100 = local_1018[(long)context];
                local_10fc = local_1068[(long)context];
                local_10f8 = local_1058[(long)context];
                local_10f4 = *(undefined4 *)((long)&local_10d8 + (long)context * 4);
                local_10f0 = uVar32;
                local_10ec = pRVar23->instID[0];
                local_10e8 = pRVar23->instPrimID[0];
                local_1118 = context;
                (ray->super_RayK<1>).tfar = local_1048[(long)context];
                local_11bc = (undefined1  [4])0xffffffff;
                local_1168.valid = (int *)local_11bc;
                local_1168.geometryUserPtr = pGVar13->userPtr;
                local_1168.context = pRVar23;
                local_1168.ray = (RTCRayN *)ray;
                local_1168.hit = (RTCHitN *)&local_1108;
                local_1168.N = 1;
                local_1120 = pGVar13;
                local_1178 = auVar57._0_4_;
                uStack_1174 = auVar57._4_4_;
                uStack_1170 = auVar57._8_4_;
                uStack_116c = auVar57._12_4_;
                if (((pGVar13->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                    ((*pGVar13->intersectionFilterN)(&local_1168), context = extraout_RDX,
                    *(int *)(Scene **)local_1168.valid != 0)) &&
                   ((pRVar14->filter == (RTCFilterFunctionN)0x0 ||
                    ((((pRVar14->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      (((local_1120->field_8).field_0x2 & 0x40) == 0)) ||
                     ((*pRVar14->filter)(&local_1168), context = extraout_RDX_00,
                     *(int *)(Scene **)local_1168.valid != 0)))))) {
                  (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_1168.hit;
                  (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_1168.hit + 4);
                  (((Vec3f *)((long)local_1168.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_1168.hit + 8);
                  *(float *)((long)local_1168.ray + 0x3c) = *(float *)(local_1168.hit + 0xc);
                  *(float *)((long)local_1168.ray + 0x40) = *(float *)(local_1168.hit + 0x10);
                  *(float *)((long)local_1168.ray + 0x44) = *(float *)(local_1168.hit + 0x14);
                  *(float *)((long)local_1168.ray + 0x48) = *(float *)(local_1168.hit + 0x18);
                  context = (RayQueryContext *)(ulong)(uint)*(float *)(local_1168.hit + 0x1c);
                  *(float *)((long)local_1168.ray + 0x4c) = *(float *)(local_1168.hit + 0x1c);
                  *(float *)((long)local_1168.ray + 0x50) = *(float *)(local_1168.hit + 0x20);
                }
                else {
                  (ray->super_RayK<1>).tfar = local_1178;
                }
                pRVar21 = local_1118;
                *(undefined4 *)(local_1198 + (long)local_1118 * 4) = 0;
                auVar57._0_4_ = (ray->super_RayK<1>).tfar;
                auVar57._4_4_ = (ray->super_RayK<1>).mask;
                auVar57._8_4_ = (ray->super_RayK<1>).id;
                auVar57._12_4_ = (ray->super_RayK<1>).flags;
                local_1198._0_4_ =
                     -(uint)((float)local_11b8._0_4_ <= auVar57._0_4_) & local_1198._0_4_;
                local_1198._4_4_ =
                     -(uint)((float)local_11b8._4_4_ <= auVar57._0_4_) & local_1198._4_4_;
                local_1198._8_4_ = -(uint)(fStack_11b0 <= auVar57._0_4_) & local_1198._8_4_;
                local_1198._12_4_ = -(uint)(fStack_11ac <= auVar57._0_4_) & local_1198._12_4_;
                uVar26 = extractps(auVar57,1);
                uVar43 = (uint)uVar26;
LAB_00d8e66c:
                local_1178 = auVar57._0_4_;
                uStack_1174 = auVar57._4_4_;
                uStack_1170 = auVar57._8_4_;
                uStack_116c = auVar57._12_4_;
                iVar17 = movmskps((int)pRVar21,local_1198);
                if (iVar17 == 0) goto LAB_00d8e96c;
                BVHNIntersector1<4,1,false,embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Moeller<4,true>>>
                ::intersect();
                uVar22 = (ulong)uVar43;
                context = (RayQueryContext *)local_1168.valid;
                auVar57._0_4_ = local_1178;
                auVar57._4_4_ = uStack_1174;
                auVar57._8_4_ = uStack_1170;
                auVar57._12_4_ = uStack_116c;
                goto LAB_00d8e601;
              }
            }
LAB_00d8e4c6:
            lVar28 = lVar28 + 1;
            uVar22 = local_11a8;
          } while (lVar28 != local_1110);
        }
        fVar82 = (ray->super_RayK<1>).tfar;
        fVar85 = local_fa8;
        fVar83 = fStack_fa4;
        fVar86 = fStack_fa0;
        fVar93 = fStack_f9c;
        fVar84 = local_fb8;
        fVar87 = fStack_fb4;
        fVar88 = fStack_fb0;
        auVar57._0_4_ = fStack_fac;
        fVar97 = local_fc8;
        fVar94 = fStack_fc4;
        fVar98 = fStack_fc0;
        fVar95 = fStack_fbc;
        fVar49 = local_fd8;
        fVar52 = fStack_fd4;
        fVar53 = fStack_fd0;
        fVar81 = fStack_fcc;
        fVar54 = local_fe8;
        fVar66 = fStack_fe4;
        fVar69 = fStack_fe0;
        fVar44 = fStack_fdc;
        fVar70 = local_ff8;
        fVar71 = fStack_ff4;
        fVar75 = fStack_ff0;
        fVar89 = fStack_fec;
        fVar79 = local_1008;
        fVar80 = fStack_1004;
        fVar90 = fStack_1000;
        fVar92 = fStack_ffc;
        fVar96 = fVar82;
        fVar99 = fVar82;
        fVar91 = fVar82;
      }
    } while (pauVar18 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }